

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

void __thiscall
google::anon_unknown_8::LogFileObject::Write
          (LogFileObject *this,bool force_flush,time_point *timestamp,char *message,
          size_t message_len)

{
  FILE *pFVar1;
  long lVar2;
  pointer pcVar3;
  undefined1 auVar4 [16];
  byte bVar5;
  bool bVar6;
  char cVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  int32 iVar11;
  long *plVar12;
  ostream *poVar13;
  string *psVar14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar15;
  int *piVar16;
  long *plVar17;
  uint32 uVar18;
  undefined7 in_register_00000031;
  char *pcVar19;
  pthread_mutex_t *__mutex;
  pointer pbVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string uidname;
  time_t t;
  __string_type __str;
  tm tm_time;
  string stripped_filename;
  string hostname;
  ostringstream time_pid_stream;
  pthread_mutex_t *local_648;
  long *local_640;
  ulong local_638;
  long local_630;
  long lStack_628;
  long *local_620;
  long local_618;
  long local_610 [2];
  pointer local_600;
  undefined4 local_5f4;
  long *local_5f0;
  long local_5e8;
  long local_5e0;
  long lStack_5d8;
  time_point *local_5d0;
  size_t local_5c8;
  long local_5c0;
  string local_5b8;
  long *local_598;
  ulong local_590;
  long local_588 [2];
  long *local_578;
  ulong local_570;
  long local_568;
  long lStack_560;
  long *local_558;
  long local_550;
  long local_548;
  long lStack_540;
  char *local_538;
  long *local_530;
  long local_528;
  long local_520;
  long lStack_518;
  long *local_510;
  long local_508;
  long local_500;
  long lStack_4f8;
  tm local_4f0;
  ScopedExit<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_sergiud[P]glog_src_logging_cc:1096:22)>
  local_4b8;
  string local_4a8;
  undefined7 uStack_4a7;
  size_t local_4a0;
  long local_498 [14];
  ios_base local_428 [96];
  char acStack_3c8 [168];
  undefined1 local_320 [112];
  ios_base local_2b0 [112];
  char acStack_240 [152];
  long local_1a8 [14];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  local_5f4 = (undefined4)CONCAT71(in_register_00000031,force_flush);
  __mutex = (pthread_mutex_t *)&this->mutex_;
  local_5c8 = message_len;
  local_538 = message;
  iVar9 = pthread_mutex_lock(__mutex);
  if (iVar9 != 0) {
    std::__throw_system_error(iVar9);
  }
  if ((this->base_filename_selected_ == true) && ((this->base_filename_)._M_string_length == 0))
  goto LAB_0010f428;
  local_4b8.functor_.current_time = (time_point)(timestamp->__d).__r;
  uVar10 = 1;
  if (fLU::FLAGS_max_log_size - 1 < 0xfff) {
    uVar10 = fLU::FLAGS_max_log_size;
  }
  local_4b8.functor_.this = this;
  if (this->file_length_ >> 0x14 < uVar10) {
    bVar6 = glog_internal_namespace_::PidHasChanged();
    if (bVar6) goto LAB_0010e43e;
  }
  else {
LAB_0010e43e:
    pFVar1 = (FILE *)(this->file_)._M_t.
                     super___uniq_ptr_impl<_IO_FILE,_std::default_delete<_IO_FILE>_>._M_t.
                     super__Tuple_impl<0UL,__IO_FILE_*,_std::default_delete<_IO_FILE>_>.
                     super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl;
    (this->file_)._M_t.super___uniq_ptr_impl<_IO_FILE,_std::default_delete<_IO_FILE>_>._M_t.
    super__Tuple_impl<0UL,__IO_FILE_*,_std::default_delete<_IO_FILE>_>.
    super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl = (_IO_FILE *)0x0;
    if (pFVar1 != (FILE *)0x0) {
      fclose(pFVar1);
    }
    this->bytes_since_flush_ = 0;
    this->dropped_mem_length_ = 0;
    this->file_length_ = 0;
    this->rollover_attempt_ = 0x1f;
  }
  if ((this->file_)._M_t.super___uniq_ptr_impl<_IO_FILE,_std::default_delete<_IO_FILE>_>._M_t.
      super__Tuple_impl<0UL,__IO_FILE_*,_std::default_delete<_IO_FILE>_>.
      super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl == (_IO_FILE *)0x0) {
    uVar10 = this->rollover_attempt_ + 1;
    this->rollover_attempt_ = uVar10;
    if (uVar10 == 0x20) {
      this->rollover_attempt_ = 0;
      local_5c0 = (timestamp->__d).__r / 1000000000;
      if (fLB::FLAGS_log_utc_time == 1) {
        gmtime_r(&local_5c0,&local_4f0);
      }
      else {
        localtime_r(&local_5c0,&local_4f0);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      lVar2 = *(long *)(local_1a8[0] + -0x18);
      if (acStack_c8[lVar2 + 1] == '\0') {
        cVar7 = std::ios::widen((char)&local_648 + (char)lVar2 + -0x60);
        acStack_c8[lVar2] = cVar7;
        acStack_c8[lVar2 + 1] = '\x01';
      }
      acStack_c8[lVar2] = '0';
      plVar12 = (long *)std::ostream::operator<<(local_1a8,local_4f0.tm_year + 0x76c);
      *(undefined8 *)((long)plVar12 + *(long *)(*plVar12 + -0x18) + 0x10) = 2;
      plVar12 = (long *)std::ostream::operator<<(plVar12,local_4f0.tm_mon + 1);
      *(undefined8 *)((long)plVar12 + *(long *)(*plVar12 + -0x18) + 0x10) = 2;
      poVar13 = (ostream *)std::ostream::operator<<(plVar12,local_4f0.tm_mday);
      local_4a8 = (string)0x2d;
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)&local_4a8,1);
      *(undefined8 *)(&poVar13->field_0x10 + (long)poVar13->_vptr_basic_ostream[-3]) = 2;
      plVar12 = (long *)std::ostream::operator<<(poVar13,local_4f0.tm_hour);
      *(undefined8 *)((long)plVar12 + *(long *)(*plVar12 + -0x18) + 0x10) = 2;
      plVar12 = (long *)std::ostream::operator<<(plVar12,local_4f0.tm_min);
      *(undefined8 *)((long)plVar12 + *(long *)(*plVar12 + -0x18) + 0x10) = 2;
      poVar13 = (ostream *)std::ostream::operator<<(plVar12,local_4f0.tm_sec);
      local_4a8 = (string)0x2e;
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)&local_4a8,1);
      iVar11 = glog_internal_namespace_::GetMainThreadPid();
      std::ostream::operator<<(poVar13,iVar11);
      std::__cxx11::stringbuf::str();
      local_5d0 = timestamp;
      if (this->base_filename_selected_ == true) {
        bVar6 = CreateLogfile(this,&local_5b8);
        if (bVar6) {
LAB_0010ec4e:
          if (fLB::FLAGS_log_file_header == '\x01') {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
            lVar2 = *(long *)(local_320._0_8_ + -0x18);
            if (acStack_240[lVar2 + 1] == '\0') {
              cVar7 = std::ios::widen((char)&local_648 + (char)lVar2 + '(');
              acStack_240[lVar2] = cVar7;
              acStack_240[lVar2 + 1] = '\x01';
            }
            acStack_240[lVar2] = '0';
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_320,"Log file created at: ",0x15);
            poVar13 = (ostream *)std::ostream::operator<<(local_320,local_4f0.tm_year + 0x76c);
            local_4a8 = (string)0x2f;
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar13,(char *)&local_4a8,1);
            *(undefined8 *)(&poVar13->field_0x10 + (long)poVar13->_vptr_basic_ostream[-3]) = 2;
            poVar13 = (ostream *)std::ostream::operator<<(poVar13,local_4f0.tm_mon + 1);
            local_4a8 = (string)0x2f;
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar13,(char *)&local_4a8,1);
            *(undefined8 *)(&poVar13->field_0x10 + (long)poVar13->_vptr_basic_ostream[-3]) = 2;
            poVar13 = (ostream *)std::ostream::operator<<(poVar13,local_4f0.tm_mday);
            local_4a8 = (string)0x20;
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar13,(char *)&local_4a8,1);
            *(undefined8 *)(&poVar13->field_0x10 + (long)poVar13->_vptr_basic_ostream[-3]) = 2;
            poVar13 = (ostream *)std::ostream::operator<<(poVar13,local_4f0.tm_hour);
            local_4a8 = (string)0x3a;
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar13,(char *)&local_4a8,1);
            *(undefined8 *)(&poVar13->field_0x10 + (long)poVar13->_vptr_basic_ostream[-3]) = 2;
            poVar13 = (ostream *)std::ostream::operator<<(poVar13,local_4f0.tm_min);
            local_4a8 = (string)0x3a;
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar13,(char *)&local_4a8,1);
            *(undefined8 *)(&poVar13->field_0x10 + (long)poVar13->_vptr_basic_ostream[-3]) = 2;
            poVar13 = (ostream *)std::ostream::operator<<(poVar13,local_4f0.tm_sec);
            pcVar19 = "\n";
            if (fLB::FLAGS_log_utc_time != 0) {
              pcVar19 = " UTC\n";
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar13,pcVar19,(ulong)fLB::FLAGS_log_utc_time * 4 + 1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13,"Running on machine: ",0x14);
            LogDestination::hostname_abi_cxx11_();
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar13,LogDestination::hostname__abi_cxx11_,DAT_0012fb90);
            local_4a8 = (string)0xa;
            std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)&local_4a8,1);
            if (DAT_0012fc18 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_320,"Application fingerprint: ",0x19);
              poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_320,
                                   (anonymous_namespace)::g_application_fingerprint_abi_cxx11_,
                                   DAT_0012fc18);
              local_4a8 = (string)0xa;
              std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)&local_4a8,1);
            }
            bVar5 = fLB::FLAGS_log_year_in_prefix;
            pcVar19 = "mmdd hh:mm:ss.uuuuuu";
            if (fLB::FLAGS_log_year_in_prefix != 0) {
              pcVar19 = "yyyymmdd hh:mm:ss.uuuuuu";
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_320,"Running duration (h:mm:ss): ",0x1c);
            auVar4 = SEXT816((timestamp->__d).__r - (this->start_time_).__d.__r) *
                     SEXT816(0x112e0be826d694b3);
            local_600 = (pointer)pcVar19;
            std::__cxx11::stringstream::stringstream((stringstream *)&local_4a8);
            lVar2 = *(long *)(CONCAT71(uStack_4a7,local_4a8) + -0x18);
            if (acStack_3c8[lVar2 + 1] == '\0') {
              cVar7 = std::ios::widen((char)&local_648 + (char)lVar2 + -0x60);
              acStack_3c8[lVar2] = cVar7;
              acStack_3c8[lVar2 + 1] = '\x01';
            }
            iVar9 = (int)(auVar4._8_8_ >> 0x1a) - (auVar4._12_4_ >> 0x1f);
            acStack_3c8[lVar2] = '0';
            poVar13 = (ostream *)std::ostream::operator<<(local_498,iVar9 / 0xe10);
            local_5f0._0_1_ = (string)0x3a;
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar13,(char *)&local_5f0,1);
            *(undefined8 *)(&poVar13->field_0x10 + (long)poVar13->_vptr_basic_ostream[-3]) = 2;
            poVar13 = (ostream *)std::ostream::operator<<(poVar13,(iVar9 / 0x3c) % 0x3c);
            local_5f0 = (long *)CONCAT71(local_5f0._1_7_,0x3a);
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar13,(char *)&local_5f0,1);
            *(undefined8 *)(&poVar13->field_0x10 + (long)poVar13->_vptr_basic_ostream[-3]) = 2;
            std::ostream::operator<<(poVar13,iVar9 % 0x3c);
            std::__cxx11::stringbuf::str();
            std::__cxx11::stringstream::~stringstream((stringstream *)&local_4a8);
            std::ios_base::~ios_base(local_428);
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_320,(char *)local_620,local_618);
            local_4a8 = (string)0xa;
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar13,(char *)&local_4a8,1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar13,"Log line format: [IWEF]",0x17);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar13,(char *)local_600,(ulong)bVar5 * 4 + 0x14);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar13,"threadid file:line] msg",0x17);
            local_4a8 = (string)0xa;
            std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)&local_4a8,1);
            if (local_620 != local_610) {
              operator_delete(local_620,local_610[0] + 1);
            }
            std::__cxx11::stringbuf::str();
            timestamp = local_5d0;
            fwrite((void *)CONCAT71(uStack_4a7,local_4a8),1,local_4a0,
                   (FILE *)(this->file_)._M_t.
                           super___uniq_ptr_impl<_IO_FILE,_std::default_delete<_IO_FILE>_>._M_t.
                           super__Tuple_impl<0UL,__IO_FILE_*,_std::default_delete<_IO_FILE>_>.
                           super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl);
            this->file_length_ = this->file_length_ + (int)local_4a0;
            this->bytes_since_flush_ = this->bytes_since_flush_ + (int)local_4a0;
            if ((long *)CONCAT71(uStack_4a7,local_4a8) != local_498) {
              operator_delete((long *)CONCAT71(uStack_4a7,local_4a8),local_498[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
            std::ios_base::~ios_base(local_2b0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
            operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          goto LAB_0010f1f3;
        }
        _GLOBAL__N_1::LogFileObject::Write((LogFileObject *)&local_5b8);
      }
      else {
        local_648 = __mutex;
        pcVar19 = glog_internal_namespace_::ProgramInvocationShortName();
        std::__cxx11::string::string<std::allocator<char>>
                  (&local_4a8,pcVar19,(allocator<char> *)local_320);
        local_320._0_8_ = local_320 + 0x10;
        local_320._8_8_ = 0;
        local_320[0x10] = '\0';
        GetHostName((string *)local_320);
        psVar14 = glog_internal_namespace_::MyUserName_abi_cxx11_();
        local_620 = local_610;
        pcVar3 = (psVar14->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_620,pcVar3,pcVar3 + psVar14->_M_string_length);
        if (local_618 == 0) {
          std::__cxx11::string::_M_replace((ulong)&local_620,0,(char *)0x0,0x122bda);
        }
        local_598 = local_588;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_598,CONCAT71(uStack_4a7,local_4a8),
                   local_4a0 + CONCAT71(uStack_4a7,local_4a8));
        std::__cxx11::string::_M_replace_aux((ulong)&local_598,local_590,0,'\x01');
        plVar12 = (long *)std::__cxx11::string::_M_append((char *)&local_598,local_320._0_8_);
        local_578 = &local_568;
        plVar17 = plVar12 + 2;
        if ((long *)*plVar12 == plVar17) {
          local_568 = *plVar17;
          lStack_560 = plVar12[3];
        }
        else {
          local_568 = *plVar17;
          local_578 = (long *)*plVar12;
        }
        local_570 = plVar12[1];
        *plVar12 = (long)plVar17;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        plVar12 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_578,local_570,0,'\x01')
        ;
        plVar17 = plVar12 + 2;
        if ((long *)*plVar12 == plVar17) {
          local_520 = *plVar17;
          lStack_518 = plVar12[3];
          local_530 = &local_520;
        }
        else {
          local_520 = *plVar17;
          local_530 = (long *)*plVar12;
        }
        local_528 = plVar12[1];
        *plVar12 = (long)plVar17;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        plVar12 = (long *)std::__cxx11::string::_M_append((char *)&local_530,(ulong)local_620);
        plVar17 = plVar12 + 2;
        if ((long *)*plVar12 == plVar17) {
          local_500 = *plVar17;
          lStack_4f8 = plVar12[3];
          local_510 = &local_500;
        }
        else {
          local_500 = *plVar17;
          local_510 = (long *)*plVar12;
        }
        local_508 = plVar12[1];
        *plVar12 = (long)plVar17;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_510);
        local_558 = &local_548;
        plVar17 = plVar12 + 2;
        if ((long *)*plVar12 == plVar17) {
          local_548 = *plVar17;
          lStack_540 = plVar12[3];
        }
        else {
          local_548 = *plVar17;
          local_558 = (long *)*plVar12;
        }
        local_550 = plVar12[1];
        *plVar12 = (long)plVar17;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_558);
        local_640 = &local_630;
        plVar17 = plVar12 + 2;
        if ((long *)*plVar12 == plVar17) {
          local_630 = *plVar17;
          lStack_628 = plVar12[3];
        }
        else {
          local_630 = *plVar17;
          local_640 = (long *)*plVar12;
        }
        local_638 = plVar12[1];
        *plVar12 = (long)plVar17;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        plVar12 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_640,local_638,0,'\x01')
        ;
        plVar17 = plVar12 + 2;
        if ((long *)*plVar12 == plVar17) {
          local_5e0 = *plVar17;
          lStack_5d8 = plVar12[3];
          local_5f0 = &local_5e0;
        }
        else {
          local_5e0 = *plVar17;
          local_5f0 = (long *)*plVar12;
        }
        local_5e8 = plVar12[1];
        *plVar12 = (long)plVar17;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        std::__cxx11::string::operator=(&local_4a8,(string *)&local_5f0);
        if (local_5f0 != &local_5e0) {
          operator_delete(local_5f0,local_5e0 + 1);
        }
        if (local_640 != &local_630) {
          operator_delete(local_640,local_630 + 1);
        }
        if (local_558 != &local_548) {
          operator_delete(local_558,local_548 + 1);
        }
        if (local_510 != &local_500) {
          operator_delete(local_510,local_500 + 1);
        }
        if (local_530 != &local_520) {
          operator_delete(local_530,local_520 + 1);
        }
        if (local_578 != &local_568) {
          operator_delete(local_578,local_568 + 1);
        }
        if (local_598 != local_588) {
          operator_delete(local_598,local_588[0] + 1);
        }
        pvVar15 = GetLoggingDirectories_abi_cxx11_();
        pbVar20 = (pvVar15->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        local_600 = (pvVar15->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
        if (pbVar20 != local_600) {
          bVar6 = false;
          do {
            local_640 = &local_630;
            pcVar3 = (pbVar20->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_640,pcVar3,pcVar3 + pbVar20->_M_string_length);
            std::__cxx11::string::append((char *)&local_640);
            plVar12 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&local_640,CONCAT71(uStack_4a7,local_4a8));
            plVar17 = plVar12 + 2;
            if ((long *)*plVar12 == plVar17) {
              local_5e0 = *plVar17;
              lStack_5d8 = plVar12[3];
              local_5f0 = &local_5e0;
            }
            else {
              local_5e0 = *plVar17;
              local_5f0 = (long *)*plVar12;
            }
            local_5e8 = plVar12[1];
            *plVar12 = (long)plVar17;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            std::__cxx11::string::operator=((string *)&this->base_filename_,(string *)&local_5f0);
            if (local_5f0 != &local_5e0) {
              operator_delete(local_5f0,local_5e0 + 1);
            }
            if (local_640 != &local_630) {
              operator_delete(local_640,local_630 + 1);
            }
            bVar8 = CreateLogfile(this,&local_5b8);
            timestamp = local_5d0;
            if (bVar8) {
              bVar6 = true;
            }
            pbVar20 = pbVar20 + 1;
          } while (pbVar20 != local_600 && !bVar8);
          if (bVar6) {
            if (local_620 != local_610) {
              operator_delete(local_620,local_610[0] + 1);
            }
            __mutex = local_648;
            if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
              operator_delete((void *)local_320._0_8_,CONCAT71(local_320._17_7_,local_320[0x10]) + 1
                             );
            }
            if ((long *)CONCAT71(uStack_4a7,local_4a8) != local_498) {
              operator_delete((long *)CONCAT71(uStack_4a7,local_4a8),local_498[0] + 1);
            }
            goto LAB_0010ec4e;
          }
        }
        perror("Could not create logging file");
        fprintf(_stderr,"COULD NOT CREATE A LOGGINGFILE %s!",local_5b8._M_dataplus._M_p);
        if (local_620 != local_610) {
          operator_delete(local_620,local_610[0] + 1);
        }
        __mutex = local_648;
        if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
          operator_delete((void *)local_320._0_8_,CONCAT71(local_320._17_7_,local_320[0x10]) + 1);
        }
        if ((long *)CONCAT71(uStack_4a7,local_4a8) != local_498) {
          operator_delete((long *)CONCAT71(uStack_4a7,local_4a8),local_498[0] + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
  }
  else {
LAB_0010f1f3:
    if (stop_writing == '\0') {
      piVar16 = __errno_location();
      *piVar16 = 0;
      fwrite(local_538,1,local_5c8,
             (FILE *)(this->file_)._M_t.
                     super___uniq_ptr_impl<_IO_FILE,_std::default_delete<_IO_FILE>_>._M_t.
                     super__Tuple_impl<0UL,__IO_FILE_*,_std::default_delete<_IO_FILE>_>.
                     super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl);
      if ((fLB::FLAGS_stop_logging_if_full_disk == '\x01') && (*piVar16 == 0x1c)) {
        stop_writing = '\x01';
      }
      else {
        this->file_length_ = this->file_length_ + (int)local_5c8;
        uVar10 = (int)local_5c8 + this->bytes_since_flush_;
        this->bytes_since_flush_ = uVar10;
        if ((999999 < uVar10 || (char)local_5f4 != '\0') ||
           ((this->next_flush_time_).__d.__r <= (timestamp->__d).__r)) {
          pFVar1 = (FILE *)(this->file_)._M_t.
                           super___uniq_ptr_impl<_IO_FILE,_std::default_delete<_IO_FILE>_>._M_t.
                           super__Tuple_impl<0UL,__IO_FILE_*,_std::default_delete<_IO_FILE>_>.
                           super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl;
          if (pFVar1 != (FILE *)0x0) {
            fflush(pFVar1);
            this->bytes_since_flush_ = 0;
          }
          (this->next_flush_time_).__d.__r =
               (long)fLI::FLAGS_logbufsecs * 1000000000 + (timestamp->__d).__r;
          if ((fLB::FLAGS_drop_log_memory == '\x01') && (0x2fffff < this->file_length_)) {
            uVar18 = (this->file_length_ & 0xfff00000) - 0x100000;
            uVar10 = uVar18 - this->dropped_mem_length_;
            if (0x1fffff < uVar10) {
              iVar9 = fileno((FILE *)(this->file_)._M_t.
                                     super___uniq_ptr_impl<_IO_FILE,_std::default_delete<_IO_FILE>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,__IO_FILE_*,_std::default_delete<_IO_FILE>_>
                                     .super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl);
              posix_fadvise(iVar9,(ulong)this->dropped_mem_length_,(ulong)uVar10,4);
              this->dropped_mem_length_ = uVar18;
            }
          }
        }
      }
    }
    else if ((this->next_flush_time_).__d.__r <= (timestamp->__d).__r) {
      stop_writing = '\0';
    }
  }
  glog_internal_namespace_::
  ScopedExit<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc:1096:22)>
  ::~ScopedExit(&local_4b8);
LAB_0010f428:
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void LogFileObject::Write(
    bool force_flush, const std::chrono::system_clock::time_point& timestamp,
    const char* message, size_t message_len) {
  std::lock_guard<std::mutex> l{mutex_};

  // We don't log if the base_name_ is "" (which means "don't write")
  if (base_filename_selected_ && base_filename_.empty()) {
    return;
  }

  auto cleanupLogs = [this, current_time = timestamp] {
    if (log_cleaner.enabled()) {
      log_cleaner.Run(current_time, base_filename_selected_, base_filename_,
                      filename_extension_);
    }
  };

  // Remove old logs
  ScopedExit<decltype(cleanupLogs)> cleanupAtEnd{cleanupLogs};

  if (file_length_ >> 20U >= MaxLogSize() || PidHasChanged()) {
    file_ = nullptr;
    file_length_ = bytes_since_flush_ = dropped_mem_length_ = 0;
    rollover_attempt_ = kRolloverAttemptFrequency - 1;
  }

  // If there's no destination file, make one before outputting
  if (file_ == nullptr) {
    // Try to rollover the log file every 32 log messages.  The only time
    // this could matter would be when we have trouble creating the log
    // file.  If that happens, we'll lose lots of log messages, of course!
    if (++rollover_attempt_ != kRolloverAttemptFrequency) return;
    rollover_attempt_ = 0;

    struct ::tm tm_time;
    std::time_t t = std::chrono::system_clock::to_time_t(timestamp);

    if (FLAGS_log_utc_time) {
      gmtime_r(&t, &tm_time);
    } else {
      localtime_r(&t, &tm_time);
    }

    // The logfile's filename will have the date/time & pid in it
    ostringstream time_pid_stream;
    time_pid_stream.fill('0');
    time_pid_stream << 1900 + tm_time.tm_year << setw(2) << 1 + tm_time.tm_mon
                    << setw(2) << tm_time.tm_mday << '-' << setw(2)
                    << tm_time.tm_hour << setw(2) << tm_time.tm_min << setw(2)
                    << tm_time.tm_sec << '.' << GetMainThreadPid();
    const string& time_pid_string = time_pid_stream.str();

    if (base_filename_selected_) {
      if (!CreateLogfile(time_pid_string)) {
        perror("Could not create log file");
        fprintf(stderr, "COULD NOT CREATE LOGFILE '%s'!\n",
                time_pid_string.c_str());
        return;
      }
    } else {
      // If no base filename for logs of this severity has been set, use a
      // default base filename of
      // "<program name>.<hostname>.<user name>.log.<severity level>.".  So
      // logfiles will have names like
      // webserver.examplehost.root.log.INFO.19990817-150000.4354, where
      // 19990817 is a date (1999 August 17), 150000 is a time (15:00:00),
      // and 4354 is the pid of the logging process.  The date & time reflect
      // when the file was created for output.
      //
      // Where does the file get put?  Successively try the directories
      // "/tmp", and "."
      string stripped_filename(
          glog_internal_namespace_::ProgramInvocationShortName());
      string hostname;
      GetHostName(&hostname);

      string uidname = MyUserName();
      // We should not call CHECK() here because this function can be
      // called after holding on to log_mutex. We don't want to
      // attempt to hold on to the same mutex, and get into a
      // deadlock. Simply use a name like invalid-user.
      if (uidname.empty()) uidname = "invalid-user";

      stripped_filename = stripped_filename + '.' + hostname + '.' + uidname +
                          ".log." + LogSeverityNames[severity_] + '.';
      // We're going to (potentially) try to put logs in several different dirs
      const vector<string>& log_dirs = GetLoggingDirectories();

      // Go through the list of dirs, and try to create the log file in each
      // until we succeed or run out of options
      bool success = false;
      for (const auto& log_dir : log_dirs) {
        base_filename_ = log_dir + "/" + stripped_filename;
        if (CreateLogfile(time_pid_string)) {
          success = true;
          break;
        }
      }
      // If we never succeeded, we have to give up
      if (success == false) {
        perror("Could not create logging file");
        fprintf(stderr, "COULD NOT CREATE A LOGGINGFILE %s!",
                time_pid_string.c_str());
        return;
      }
    }

    // Write a header message into the log file
    if (FLAGS_log_file_header) {
      ostringstream file_header_stream;
      file_header_stream.fill('0');
      file_header_stream << "Log file created at: " << 1900 + tm_time.tm_year
                         << '/' << setw(2) << 1 + tm_time.tm_mon << '/'
                         << setw(2) << tm_time.tm_mday << ' ' << setw(2)
                         << tm_time.tm_hour << ':' << setw(2) << tm_time.tm_min
                         << ':' << setw(2) << tm_time.tm_sec
                         << (FLAGS_log_utc_time ? " UTC\n" : "\n")
                         << "Running on machine: " << LogDestination::hostname()
                         << '\n';

      if (!g_application_fingerprint.empty()) {
        file_header_stream << "Application fingerprint: "
                           << g_application_fingerprint << '\n';
      }
      const char* const date_time_format = FLAGS_log_year_in_prefix
                                               ? "yyyymmdd hh:mm:ss.uuuuuu"
                                               : "mmdd hh:mm:ss.uuuuuu";
      file_header_stream
          << "Running duration (h:mm:ss): "
          << PrettyDuration(
                 std::chrono::duration_cast<std::chrono::duration<int>>(
                     timestamp - start_time_))
          << '\n'
          << "Log line format: [IWEF]" << date_time_format << " "
          << "threadid file:line] msg" << '\n';
      const string& file_header_string = file_header_stream.str();

      const size_t header_len = file_header_string.size();
      fwrite(file_header_string.data(), 1, header_len, file_.get());
      file_length_ += header_len;
      bytes_since_flush_ += header_len;
    }
  }

  // Write to LOG file
  if (!stop_writing) {
    // fwrite() doesn't return an error when the disk is full, for
    // messages that are less than 4096 bytes. When the disk is full,
    // it returns the message length for messages that are less than
    // 4096 bytes. fwrite() returns 4096 for message lengths that are
    // greater than 4096, thereby indicating an error.
    errno = 0;
    fwrite(message, 1, message_len, file_.get());
    if (FLAGS_stop_logging_if_full_disk &&
        errno == ENOSPC) {  // disk full, stop writing to disk
      stop_writing = true;  // until the disk is
      return;
    } else {
      file_length_ += message_len;
      bytes_since_flush_ += message_len;
    }
  } else {
    if (timestamp >= next_flush_time_) {
      stop_writing = false;  // check to see if disk has free space.
    }
    return;  // no need to flush
  }

  // See important msgs *now*.  Also, flush logs at least every 10^6 chars,
  // or every "FLAGS_logbufsecs" seconds.
  if (force_flush || (bytes_since_flush_ >= 1000000) ||
      (timestamp >= next_flush_time_)) {
    FlushUnlocked(timestamp);
#ifdef GLOG_OS_LINUX
    // Only consider files >= 3MiB
    if (FLAGS_drop_log_memory && file_length_ >= (3U << 20U)) {
      // Don't evict the most recent 1-2MiB so as not to impact a tailer
      // of the log file and to avoid page rounding issue on linux < 4.7
      uint32 total_drop_length =
          (file_length_ & ~((1U << 20U) - 1U)) - (1U << 20U);
      uint32 this_drop_length = total_drop_length - dropped_mem_length_;
      if (this_drop_length >= (2U << 20U)) {
        // Only advise when >= 2MiB to drop
#  if defined(__ANDROID__) && defined(__ANDROID_API__) && (__ANDROID_API__ < 21)
        // 'posix_fadvise' introduced in API 21:
        // * https://android.googlesource.com/platform/bionic/+/6880f936173081297be0dc12f687d341b86a4cfa/libc/libc.map.txt#732
#  else
        posix_fadvise(
            fileno(file_.get()), static_cast<off_t>(dropped_mem_length_),
            static_cast<off_t>(this_drop_length), POSIX_FADV_DONTNEED);
#  endif
        dropped_mem_length_ = total_drop_length;
      }
    }
#endif
  }
}